

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall
ddd::DaTrie<true,_true,_true>::insert_edge_(DaTrie<true,_true,_true> *this,Query *query)

{
  bool bVar1;
  byte bVar2;
  uint8_t uVar3;
  uint32_t uVar4;
  uint node_pos;
  uint32_t uVar5;
  uint uVar6;
  vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *blocks;
  vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *pvVar7;
  reference pvVar8;
  reference pvVar9;
  DaTrie<true,_true,_true> *in_RSI;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *in_RDI;
  uint32_t _child_pos;
  uint32_t child_pos;
  Query *in_stack_00000288;
  DaTrie<true,_true,_true> *in_stack_00000290;
  uint32_t node_pos_00;
  Query *this_00;
  
  uVar4 = Query::node_pos((Query *)in_RSI);
  blocks = (vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *)(ulong)uVar4;
  pvVar7 = (vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *)
           std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::size(in_RDI);
  if (pvVar7 <= blocks) {
    __assert_fail("query.node_pos() < bc_.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x1ef,
                  "void ddd::DaTrie<true, true, true>::insert_edge_(Query &) [WithBLM = true, WithNLM = true, Prefix = true]"
                 );
  }
  uVar4 = Query::node_pos((Query *)in_RSI);
  pvVar8 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar4);
  bVar1 = Bc::is_fixed(pvVar8);
  if (bVar1) {
    uVar4 = Query::node_pos((Query *)in_RSI);
    pvVar8 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar4);
    uVar4 = Bc::base(pvVar8);
    bVar2 = Query::label((Query *)in_RSI);
    node_pos = uVar4 ^ bVar2;
    pvVar8 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)node_pos);
    bVar1 = Bc::is_fixed(pvVar8);
    if (bVar1) {
      solve_(in_stack_00000290,in_stack_00000288);
      uVar4 = Query::node_pos((Query *)in_RSI);
      pvVar8 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar4);
      uVar4 = Bc::base(pvVar8);
      bVar2 = Query::label((Query *)in_RSI);
      node_pos = uVar4 ^ bVar2;
    }
    fix_(in_RSI,node_pos,blocks);
    pvVar8 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)node_pos);
    uVar4 = Query::node_pos((Query *)in_RSI);
    Bc::set_check(pvVar8,uVar4);
    node_pos_00 = (uint32_t)((ulong)pvVar8 >> 0x20);
    uVar4 = Query::node_pos((Query *)in_RSI);
    pvVar8 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar4);
    uVar4 = Bc::base(pvVar8);
    this_00 = (Query *)(in_RDI + 3);
    uVar5 = Query::node_pos((Query *)in_RSI);
    pvVar9 = std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::operator[]
                       ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)this_00,
                        (ulong)uVar5);
    uVar6 = uVar4 ^ pvVar9->child;
    pvVar9 = std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::operator[]
                       ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)(in_RDI + 3),
                        (ulong)uVar6);
    uVar3 = pvVar9->sib;
    pvVar9 = std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::operator[]
                       ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)(in_RDI + 3),
                        (ulong)node_pos);
    pvVar9->sib = uVar3;
    uVar3 = Query::label((Query *)in_RSI);
    pvVar9 = std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::operator[]
                       ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)(in_RDI + 3),
                        (ulong)uVar6);
    pvVar9->sib = uVar3;
    Query::next(this_00,node_pos_00);
    return;
  }
  __assert_fail("bc_[query.node_pos()].is_fixed()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                ,0x1f0,
                "void ddd::DaTrie<true, true, true>::insert_edge_(Query &) [WithBLM = true, WithNLM = true, Prefix = true]"
               );
}

Assistant:

void insert_edge_(Query& query) {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_fixed());

    auto child_pos = bc_[query.node_pos()].base() ^query.label();

    if (bc_[child_pos].is_fixed()) {
      solve_(query);
      child_pos = bc_[query.node_pos()].base() ^ query.label();
    }

    fix_(child_pos, blocks_);
    bc_[child_pos].set_check(query.node_pos());

    if (WithNLM) {
      auto _child_pos = bc_[query.node_pos()].base() ^node_links_[query.node_pos()].child;
      node_links_[child_pos].sib = node_links_[_child_pos].sib;
      node_links_[_child_pos].sib = query.label();
    }
    query.next(child_pos);
  }